

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O0

void Hacl_Salsa20_hsalsa20(uint8_t *output,uint8_t *key,uint8_t *nonce)

{
  uint8_t *in_stack_00000090;
  uint8_t *in_stack_00000098;
  uint8_t *in_stack_000000a0;
  
  Hacl_Impl_HSalsa20_crypto_core_hsalsa20(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  return;
}

Assistant:

void Hacl_Salsa20_hsalsa20(uint8_t *output, uint8_t *key, uint8_t *nonce)
{
  Hacl_Impl_HSalsa20_crypto_core_hsalsa20(output, nonce, key);
}